

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_lrzip.c
# Opt level: O0

int archive_write_lrzip_options(archive_write_filter *f,char *key,char *value)

{
  long lVar1;
  int iVar2;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  write_lrzip *data;
  int local_4;
  
  lVar1 = *(long *)(in_RDI + 0x40);
  iVar2 = strcmp(in_RSI,"compression");
  if (iVar2 == 0) {
    if (in_RDX == (char *)0x0) {
      local_4 = -0x14;
    }
    else {
      iVar2 = strcmp(in_RDX,"bzip2");
      if (iVar2 == 0) {
        *(undefined4 *)(lVar1 + 0xc) = 1;
      }
      else {
        iVar2 = strcmp(in_RDX,"gzip");
        if (iVar2 == 0) {
          *(undefined4 *)(lVar1 + 0xc) = 2;
        }
        else {
          iVar2 = strcmp(in_RDX,"lzo");
          if (iVar2 == 0) {
            *(undefined4 *)(lVar1 + 0xc) = 3;
          }
          else {
            iVar2 = strcmp(in_RDX,"none");
            if (iVar2 == 0) {
              *(undefined4 *)(lVar1 + 0xc) = 4;
            }
            else {
              iVar2 = strcmp(in_RDX,"zpaq");
              if (iVar2 != 0) {
                return -0x14;
              }
              *(undefined4 *)(lVar1 + 0xc) = 5;
            }
          }
        }
      }
      local_4 = 0;
    }
  }
  else {
    iVar2 = strcmp(in_RSI,"compression-level");
    if (iVar2 == 0) {
      if ((((in_RDX == (char *)0x0) || (*in_RDX < '1')) || ('9' < *in_RDX)) || (in_RDX[1] != '\0'))
      {
        local_4 = -0x14;
      }
      else {
        *(int *)(lVar1 + 8) = *in_RDX + -0x30;
        local_4 = 0;
      }
    }
    else {
      local_4 = -0x14;
    }
  }
  return local_4;
}

Assistant:

static int
archive_write_lrzip_options(struct archive_write_filter *f, const char *key,
    const char *value)
{
	struct write_lrzip *data = (struct write_lrzip *)f->data;

	if (strcmp(key, "compression") == 0) {
		if (value == NULL)
			return (ARCHIVE_WARN);
		else if (strcmp(value, "bzip2") == 0)
			data->compression = bzip2;
		else if (strcmp(value, "gzip") == 0)
			data->compression = gzip;
		else if (strcmp(value, "lzo") == 0)
			data->compression = lzo;
		else if (strcmp(value, "none") == 0)
			data->compression = none;
		else if (strcmp(value, "zpaq") == 0)
			data->compression = zpaq;
		else
			return (ARCHIVE_WARN);
		return (ARCHIVE_OK);
	} else if (strcmp(key, "compression-level") == 0) {
		if (value == NULL || !(value[0] >= '1' && value[0] <= '9') ||
		    value[1] != '\0')
			return (ARCHIVE_WARN);
		data->compression_level = value[0] - '0';
		return (ARCHIVE_OK);
	}
	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}